

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::create_non_edge_constraint(Proof *this,int p,int q)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  mapped_type *pmVar2;
  ostream *poVar3;
  pair<int,_int> local_38;
  long local_30;
  
  poVar3 = (ostream *)
           &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-1 x",4);
  local_38 = (pair<int,_int>)(long)p;
  pmVar2 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         binary_variable_mappings,(key_type_conflict1 *)&local_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," -1 x",5);
  local_30 = (long)q;
  pmVar2 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         binary_variable_mappings,&local_30);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," >= -1 ;\n",9);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->nb_constraints = (_Var1._M_head_impl)->nb_constraints + 1;
  if ((_Var1._M_head_impl)->recover_encoding == false) {
    local_38.second = q;
    local_38.first = p;
    std::
    _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
    ::_M_emplace_unique<std::pair<int,int>,long&>
              ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
                *)&(_Var1._M_head_impl)->non_edge_constraints,&local_38,
               &(_Var1._M_head_impl)->nb_constraints);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    local_38.second = p;
    local_38.first = q;
    std::
    _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
    ::_M_emplace_unique<std::pair<int,int>,long&>
              ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
                *)&(_Var1._M_head_impl)->non_edge_constraints,&local_38,
               &(_Var1._M_head_impl)->nb_constraints);
  }
  return;
}

Assistant:

auto Proof::create_non_edge_constraint(int p, int q) -> void
{
    _imp->model_stream << "-1 x" << _imp->binary_variable_mappings[p] << " -1 x" << _imp->binary_variable_mappings[q] << " >= -1 ;\n";

    ++_imp->nb_constraints;
    if (! _imp->recover_encoding) {
        _imp->non_edge_constraints.emplace(pair{p, q}, _imp->nb_constraints);
        _imp->non_edge_constraints.emplace(pair{q, p}, _imp->nb_constraints);
    }
}